

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O3

bool __thiscall
BlockFilterIndex::LookupFilterHashRange
          (BlockFilterIndex *this,int start_height,CBlockIndex *stop_index,
          vector<uint256,_std::allocator<uint256>_> *hashes_out)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pDVar6;
  pointer pDVar7;
  bool bVar8;
  DBVal *entry;
  pointer __args;
  long in_FS_OFFSET;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> entries;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = LookupRange(&((this->m_db)._M_t.
                        super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                        .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                       super_CDBWrapper,&(this->super_BaseIndex).m_name,start_height,stop_index,
                      &local_48);
  pDVar7 = local_48.
           super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar6 = local_48.
           super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar8) {
    puVar2 = (hashes_out->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((hashes_out->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (hashes_out->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    std::vector<uint256,_std::allocator<uint256>_>::reserve
              (hashes_out,
               ((long)local_48.
                      super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
    for (__args = pDVar6; __args != pDVar7; __args = __args + 1) {
      __position._M_current =
           (hashes_out->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (hashes_out->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                  ((vector<uint256,std::allocator<uint256>> *)hashes_out,__position,&__args->hash);
      }
      else {
        uVar3 = *(undefined8 *)(__args->hash).super_base_blob<256U>.m_data._M_elems;
        uVar4 = *(undefined8 *)((__args->hash).super_base_blob<256U>.m_data._M_elems + 8);
        uVar5 = *(undefined8 *)((__args->hash).super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((__args->hash).super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar5;
        *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems = uVar3;
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
             uVar4;
        ppuVar1 = &(hashes_out->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
  }
  if (pDVar6 != (pointer)0x0) {
    operator_delete(pDVar6,(long)local_48.
                                 super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::LookupFilterHashRange(int start_height, const CBlockIndex* stop_index,
                                             std::vector<uint256>& hashes_out) const

{
    std::vector<DBVal> entries;
    if (!LookupRange(*m_db, m_name, start_height, stop_index, entries)) {
        return false;
    }

    hashes_out.clear();
    hashes_out.reserve(entries.size());
    for (const auto& entry : entries) {
        hashes_out.push_back(entry.hash);
    }
    return true;
}